

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ms.c
# Opt level: O2

void bp_setup_ms(mod2sparse *H,double error_prob,double *log_prob_ratios,char *decoding)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  mod2entry *pmVar4;
  
  log_prob_ratio_initial = log((1.0 - error_prob) / error_prob);
  uVar3 = 0;
  uVar2 = (ulong)(uint)H->n_cols;
  if (H->n_cols < 1) {
    uVar2 = uVar3;
  }
  for (; dVar1 = log_prob_ratio_initial, uVar3 != uVar2; uVar3 = uVar3 + 1) {
    pmVar4 = H->cols + uVar3;
    while (pmVar4 = pmVar4->down, -1 < pmVar4->row) {
      pmVar4->pr = dVar1;
      pmVar4->lr = 1.0;
    }
    decoding[uVar3] = '\0';
  }
  return;
}

Assistant:

void bp_setup_ms(mod2sparse *H,
    double error_prob,
    double *log_prob_ratios,
    char *decoding)
    {

  mod2entry *e;
  int N;
  int j;
  

  log_prob_ratio_initial=log((1-error_prob)/error_prob);
  N = mod2sparse_cols(H);

  for (j = 0; j<N; j++)
    { 
      for (e = mod2sparse_first_in_col(H,j);
            !mod2sparse_at_end(e);
            e = mod2sparse_next_in_col(e))
        { 
          e->pr = log_prob_ratio_initial;
          e->lr = 1;
        }
    // log_prob_ratios[j]=log_prob_ratio_initial;
    decoding[j]=0;
    }

}